

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_traits.hpp
# Opt level: O1

type jsoncons::unicode_traits::detect_encoding_from_bom<char>(char *data,size_t length)

{
  ulong uVar1;
  type tVar2;
  type tVar3;
  type tVar4;
  type tVar5;
  type tVar6;
  
  if (3 < length) {
    if (*(int *)data == 0xfeff) {
      tVar3.ptr = data + 4;
      tVar3._8_8_ = 4;
      return tVar3;
    }
    if (*(int *)data == -0x20000) {
      tVar5.ptr = data + 4;
      tVar5._8_8_ = 5;
      return tVar5;
    }
  }
  if (1 < length) {
    if (*(short *)data == -0x101) {
      tVar4.ptr = data + 2;
      tVar4._8_8_ = 2;
      return tVar4;
    }
    if (*(short *)data == -2) {
      tVar6.ptr = data + 2;
      tVar6._8_8_ = 3;
      return tVar6;
    }
  }
  uVar1 = 0;
  if (2 < length) {
    uVar1 = (ulong)(data[2] == -0x41 && *(short *)data == -0x4411);
    data = data + uVar1 * 3;
  }
  tVar2._8_8_ = uVar1;
  tVar2.ptr = data;
  return tVar2;
}

Assistant:

typename std::enable_if<ext_traits::is_char8<CharT>::value,detect_encoding_result<CharT>>::type
    detect_encoding_from_bom(const CharT* data, std::size_t length)
    {
        const uint8_t bom_utf8[] = {0xef,0xbb,0xbf}; 
        const uint8_t bom_utf16le[] = {0xff,0xfe}; 
        const uint8_t bom_utf16be[] = {0xfe,0xff}; 
        const uint8_t bom_utf32le[] = {0xff,0xfe,0x00,0x00}; 
        const uint8_t bom_utf32be[] = {0x00,0x00,0xfe,0xff}; 

        if (length >= 4 && !memcmp(data,bom_utf32le,4))
        {
            return detect_encoding_result<CharT>{data+4,encoding_kind::utf32le};
        }
        else if (length >= 4 && !memcmp(data,bom_utf32be,4))
        {
            return detect_encoding_result<CharT>{data+4,encoding_kind::utf32be};
        }
        else if (length >= 2 && !memcmp(data,bom_utf16le,2))
        {
            return detect_encoding_result<CharT>{data+2,encoding_kind::utf16le};
        }
        else if (length >= 2 && !memcmp(data,bom_utf16be,2))
        {
            return detect_encoding_result<CharT>{data+2,encoding_kind::utf16be};
        }
        else if (length >= 3 && !memcmp(data,bom_utf8,3))
        {
            return detect_encoding_result<CharT>{data+3,encoding_kind::utf8};
        }
        else
        {
            return detect_encoding_result<CharT>{data,encoding_kind::undetected};
        }
    }